

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

long xmlGetLineNoInternal(xmlNode *node,int depth)

{
  xmlElementType xVar1;
  void *pvVar2;
  _xmlNode *p_Var3;
  
  while( true ) {
    if (node == (xmlNode *)0x0) {
      return -1;
    }
    if (4 < depth) {
      return -1;
    }
    xVar1 = node->type;
    if ((xVar1 < XML_DOCUMENT_NODE) &&
       ((0x18aU >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) break;
    p_Var3 = node->prev;
    if (((p_Var3 == (_xmlNode *)0x0) || (XML_COMMENT_NODE < p_Var3->type)) ||
       ((0x18aU >> (p_Var3->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) {
      p_Var3 = node->parent;
      if (p_Var3 == (_xmlNode *)0x0) {
        return -1;
      }
      if (p_Var3->type != XML_ELEMENT_NODE) {
        return -1;
      }
    }
    depth = depth + 1;
    node = p_Var3;
  }
  if ((ulong)node->line != 0xffff) {
    return (ulong)node->line;
  }
  if (xVar1 == XML_ELEMENT_NODE) {
    p_Var3 = node->children;
    if (p_Var3 == (_xmlNode *)0x0) goto LAB_0018119e;
  }
  else {
    if ((xVar1 == XML_TEXT_NODE) && (pvVar2 = node->psvi, pvVar2 != (void *)0x0)) goto LAB_001811b1;
LAB_0018119e:
    p_Var3 = node->next;
    if ((p_Var3 == (_xmlNode *)0x0) && (p_Var3 = node->prev, p_Var3 == (_xmlNode *)0x0)) {
      return 0xffff;
    }
  }
  pvVar2 = (void *)xmlGetLineNoInternal(p_Var3,depth + 1);
LAB_001811b1:
  if ((pvVar2 != (void *)0xffff) && (pvVar2 != (void *)0xffffffffffffffff)) {
    return (long)pvVar2;
  }
  return 0xffff;
}

Assistant:

static long
xmlGetLineNoInternal(const xmlNode *node, int depth)
{
    long result = -1;

    if (depth >= 5)
        return(-1);

    if (!node)
        return result;
    if ((node->type == XML_ELEMENT_NODE) ||
        (node->type == XML_TEXT_NODE) ||
	(node->type == XML_COMMENT_NODE) ||
	(node->type == XML_PI_NODE)) {
	if (node->line == 65535) {
	    if ((node->type == XML_TEXT_NODE) && (node->psvi != NULL))
	        result = (long) (ptrdiff_t) node->psvi;
	    else if ((node->type == XML_ELEMENT_NODE) &&
	             (node->children != NULL))
	        result = xmlGetLineNoInternal(node->children, depth + 1);
	    else if (node->next != NULL)
	        result = xmlGetLineNoInternal(node->next, depth + 1);
	    else if (node->prev != NULL)
	        result = xmlGetLineNoInternal(node->prev, depth + 1);
	}
	if ((result == -1) || (result == 65535))
	    result = (long) node->line;
    } else if ((node->prev != NULL) &&
             ((node->prev->type == XML_ELEMENT_NODE) ||
	      (node->prev->type == XML_TEXT_NODE) ||
	      (node->prev->type == XML_COMMENT_NODE) ||
	      (node->prev->type == XML_PI_NODE)))
        result = xmlGetLineNoInternal(node->prev, depth + 1);
    else if ((node->parent != NULL) &&
             (node->parent->type == XML_ELEMENT_NODE))
        result = xmlGetLineNoInternal(node->parent, depth + 1);

    return result;
}